

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

Variable __thiscall LiteScript::CreateVariable(LiteScript *this,Memory *memory,char *value)

{
  Object *pOVar1;
  uint *extraout_RDX;
  Variable VVar2;
  String local_30;
  
  Memory::Create((Memory *)this,(Type *)memory);
  String::String(&local_30,value);
  pOVar1 = Variable::operator->((Variable *)this);
  String::operator=((String *)pOVar1->data,&local_30);
  std::__cxx11::u32string::~u32string((u32string *)&local_30);
  VVar2.nb_ref = extraout_RDX;
  VVar2.obj = (Object *)this;
  return VVar2;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, const char *value) {
    Variable v = memory.Create(Type::STRING);
    v->GetData<String>() = String(value);
    return v;
}